

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_LegacyClosedEnumInherited_Test::
CppGeneratorTest_LegacyClosedEnumInherited_Test
          (CppGeneratorTest_LegacyClosedEnumInherited_Test *this)

{
  CppGeneratorTest_LegacyClosedEnumInherited_Test *this_local;
  
  CppGeneratorTest::CppGeneratorTest(&this->super_CppGeneratorTest);
  (this->super_CppGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CppGeneratorTest_LegacyClosedEnumInherited_Test_02a016c8;
  return;
}

Assistant:

TEST_F(CppGeneratorTest, LegacyClosedEnumInherited) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/cpp_features.proto";
    option features.(pb.cpp).legacy_closed_enum = true;

    enum TestEnum {
      TEST_ENUM_UNKNOWN = 0;
    }
    message Foo {
      TestEnum bar = 1;
      int32 baz = 2;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");

  ExpectWarningSubstring(
      "foo.proto: warning: Feature pb.CppFeatures.legacy_closed_enum has "
      "been deprecated in edition 2023");
}